

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  uint uVar1;
  uint uVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  
  pFVar3 = (this->left_->dx_).ptr_to_data;
  pFVar4 = (this->right_->dx_).ptr_to_data;
  __return_storage_ptr__->val_ = pFVar3[i].val_ + pFVar4[i].val_;
  uVar1 = pFVar3[i].dx_.num_elts;
  uVar2 = pFVar4[i].dx_.num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar2) {
    (__return_storage_ptr__->dx_).num_elts = uVar2;
    pdVar5 = (double *)operator_new__((ulong)uVar2 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  uVar1 = pFVar3[i].dx_.num_elts;
  uVar2 = pFVar4[i].dx_.num_elts;
  uVar6 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar6 = uVar1;
  }
  if (0 < (int)uVar6) {
    pdVar5 = (__return_storage_ptr__->dx_).ptr_to_data;
    uVar7 = (ulong)uVar6;
    lVar8 = 0;
    do {
      pdVar9 = (double *)((long)pFVar3[i].dx_.ptr_to_data + lVar8);
      if (uVar1 == 0) {
        pdVar9 = &pFVar3[i].defaultVal;
      }
      pdVar10 = (double *)((long)pFVar4[i].dx_.ptr_to_data + lVar8);
      if (uVar2 == 0) {
        pdVar10 = &pFVar4[i].defaultVal;
      }
      *(double *)((long)pdVar5 + lVar8) = *pdVar9 + *pdVar10;
      lVar8 = lVar8 + 8;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}